

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float64_to_float128_x86_64(float64 a,float_status *status)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t a_1;
  float128 fVar7;
  float128 fVar8;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar4 = a & 0xfffffffffffff;
  uVar6 = a & 0x8000000000000000;
  uVar5 = (uint)(a >> 0x34) & 0x7ff;
  if (uVar5 == 0) {
    if (uVar4 != 0) {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar5 = ((uint)lVar1 ^ 0x3f) + 0xf5;
      uVar4 = uVar4 << ((byte)uVar5 & 0x3f);
      uVar5 = -(uVar5 & 0xff);
      goto LAB_004e753f;
    }
  }
  else {
    if (uVar5 != 0x7ff) {
LAB_004e753f:
      fVar7.low = uVar4 << 0x3c;
      fVar7.high = (uVar4 >> 4 | uVar6) + ((ulong)(uVar5 + 0x3c00) << 0x30);
      return fVar7;
    }
    if (uVar4 == 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = a | 0x7fff000000000000;
      return (float128)(auVar2 << 0x40);
    }
    if ((a & 0x7ffffffffffff) != 0 && (a & 0x7ff8000000000000) == 0x7ff0000000000000) {
      status->float_exception_flags = status->float_exception_flags | 1;
    }
    if (status->default_nan_mode == '\0') {
      fVar8.high = uVar6 | a >> 4 | 0x7fff000000000000;
      fVar8.low = a << 0x3c;
      return fVar8;
    }
    uVar6 = 0xffff800000000000;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  return (float128)(auVar3 << 0x40);
}

Assistant:

float128 float64_to_float128(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloat128(float64ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    shift128Right( aSig, 0, 4, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp + 0x3C00, zSig0, zSig1 );

}